

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

void __thiscall
booster::locale::basic_message<char>::swap(basic_message<char> *this,basic_message<char> *other)

{
  int iVar1;
  char_type *pcVar2;
  
  iVar1 = this->n_;
  this->n_ = other->n_;
  other->n_ = iVar1;
  pcVar2 = this->c_id_;
  this->c_id_ = other->c_id_;
  other->c_id_ = pcVar2;
  pcVar2 = this->c_context_;
  this->c_context_ = other->c_context_;
  other->c_context_ = pcVar2;
  pcVar2 = this->c_plural_;
  this->c_plural_ = other->c_plural_;
  other->c_plural_ = pcVar2;
  std::__cxx11::string::swap((string *)&this->id_);
  std::__cxx11::string::swap((string *)&this->context_);
  std::__cxx11::string::swap((string *)&this->plural_);
  return;
}

Assistant:

void swap(basic_message &other)
            {
                std::swap(n_,other.n_);
                std::swap(c_id_,other.c_id_);
                std::swap(c_context_,other.c_context_);
                std::swap(c_plural_,other.c_plural_);

                id_.swap(other.id_);
                context_.swap(other.context_);
                plural_.swap(other.plural_);
            }